

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::GlobalsScopeVariablesGroupDisplay::GlobalsScopeVariablesGroupDisplay
          (GlobalsScopeVariablesGroupDisplay *this,VariableWalkerBase *walker,
          ResolvedObject *resolvedObject)

{
  ResolvedObject *resolvedObject_local;
  VariableWalkerBase *walker_local;
  GlobalsScopeVariablesGroupDisplay *this_local;
  
  RecyclableObjectDisplay::RecyclableObjectDisplay
            (&this->super_RecyclableObjectDisplay,resolvedObject,0);
  (this->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay._vptr_IDiagObjectModelDisplay
       = (_func_int **)&PTR_Name_01deb290;
  this->globalsGroupWalker = walker;
  return;
}

Assistant:

GlobalsScopeVariablesGroupDisplay::GlobalsScopeVariablesGroupDisplay(VariableWalkerBase *walker, ResolvedObject* resolvedObject)
        : globalsGroupWalker(walker),
          RecyclableObjectDisplay(resolvedObject)
    {
    }